

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

void __thiscall gnuplotio::PlotData::PlotData(PlotData *this,PlotData *param_1)

{
  bool bVar1;
  PlotData *param_1_local;
  PlotData *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  this->has_data = param_1->has_data;
  bVar1 = param_1->is_inline;
  this->is_text = param_1->is_text;
  this->is_inline = bVar1;
  std::__cxx11::string::string((string *)&this->data,(string *)&param_1->data);
  std::__cxx11::string::string((string *)&this->filename,(string *)&param_1->filename);
  std::__cxx11::string::string((string *)&this->arr_or_rec,(string *)&param_1->arr_or_rec);
  std::__cxx11::string::string((string *)&this->bin_fmt,(string *)&param_1->bin_fmt);
  std::__cxx11::string::string((string *)&this->bin_size,(string *)&param_1->bin_size);
  return;
}

Assistant:

PlotData() { }